

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::pop
          (iterator *this)

{
  ulong uVar1;
  stack_entry *psVar2;
  ulong uVar3;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x17d,
                  "void unodb::db<unsigned long, std::span<const std::byte>>::iterator::pop() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  psVar2 = top(this);
  uVar3 = (ulong)(psVar2->prefix).f.key_prefix_length;
  uVar1 = (this->keybuf_).off;
  if (uVar3 <= uVar1) {
    (this->keybuf_).off = uVar1 - uVar3;
    std::
    deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::pop_back(&(this->stack_).c);
    return;
  }
  __assert_fail("off >= n",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                ,0x1d8,"void unodb::detail::key_buffer::pop(size_t)");
}

Assistant:

void pop() noexcept {
      UNODB_DETAIL_ASSERT(!empty());

      const auto prefix_len = top().prefix.length();
      keybuf_.pop(prefix_len);
      stack_.pop();
    }